

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::
HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,_unsigned_long,_kj::CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:417:45),_kj::Array<char>_>,_kj::_::PropagateException>_>
::disposeImpl(HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,_unsigned_long,_kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:417:45),_kj::Array<char>_>,_kj::_::PropagateException>_>
              *this,void *pointer)

{
  long lVar1;
  undefined8 uVar2;
  long *plVar3;
  
  if (pointer != (void *)0x0) {
    TransformPromiseNodeBase::dropDependency((TransformPromiseNodeBase *)pointer);
    lVar1 = *(long *)((long)pointer + 0x38);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)pointer + 0x40);
      *(undefined8 *)((long)pointer + 0x38) = 0;
      *(undefined8 *)((long)pointer + 0x40) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x48))
                (*(undefined8 **)((long)pointer + 0x48),lVar1,1,uVar2,uVar2,0);
    }
    *(undefined ***)pointer = &PTR_onReady_00465898;
    plVar3 = *(long **)((long)pointer + 0x10);
    if (plVar3 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x10) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 8))
                (*(undefined8 **)((long)pointer + 8),(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    operator_delete(pointer,0x58);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }